

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O3

void uv__stream_destroy(uv_stream_t *stream)

{
  uint uVar1;
  long lVar2;
  undefined8 *puVar3;
  int iVar4;
  long *plVar5;
  
  iVar4 = uv__io_active(&stream->io_watcher,5);
  if (iVar4 != 0) {
    __assert_fail("!uv__io_active(&stream->io_watcher, POLLIN | POLLOUT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x1be,"void uv__stream_destroy(uv_stream_t *)");
  }
  if ((stream->flags & 2) == 0) {
    __assert_fail("stream->flags & UV_HANDLE_CLOSED",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x1bf,"void uv__stream_destroy(uv_stream_t *)");
  }
  if (stream->connect_req != (uv_connect_t *)0x0) {
    uVar1 = (stream->loop->active_reqs).count;
    if (uVar1 == 0) {
      __assert_fail("uv__has_active_reqs(stream->loop)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x1c2,"void uv__stream_destroy(uv_stream_t *)");
    }
    (stream->loop->active_reqs).count = uVar1 - 1;
    (*stream->connect_req->cb)(stream->connect_req,-0x7d);
    stream->connect_req = (uv_connect_t *)0x0;
  }
  plVar5 = (long *)stream->write_queue[0];
  if (stream->write_queue != (void **)plVar5) {
    do {
      lVar2 = *plVar5;
      *(long *)plVar5[1] = lVar2;
      *(long *)(lVar2 + 8) = plVar5[1];
      *(undefined4 *)((long)plVar5 + 0x24) = 0xffffff83;
      *plVar5 = (long)stream->write_completed_queue;
      puVar3 = (undefined8 *)stream->write_completed_queue[1];
      plVar5[1] = (long)puVar3;
      *puVar3 = plVar5;
      stream->write_completed_queue[1] = plVar5;
      plVar5 = (long *)stream->write_queue[0];
    } while (stream->write_queue != (void **)plVar5);
  }
  uv__write_callbacks(stream);
  uv__drain(stream);
  if (stream->write_queue_size == 0) {
    return;
  }
  __assert_fail("stream->write_queue_size == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                ,0x1cb,"void uv__stream_destroy(uv_stream_t *)");
}

Assistant:

void uv__stream_destroy(uv_stream_t* stream) {
  assert(!uv__io_active(&stream->io_watcher, POLLIN | POLLOUT));
  assert(stream->flags & UV_HANDLE_CLOSED);

  if (stream->connect_req) {
    uv__req_unregister(stream->loop, stream->connect_req);
    stream->connect_req->cb(stream->connect_req, UV_ECANCELED);
    stream->connect_req = NULL;
  }

  uv__stream_flush_write_queue(stream, UV_ECANCELED);
  uv__write_callbacks(stream);
  uv__drain(stream);

  assert(stream->write_queue_size == 0);
}